

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::Arith3Inst::display(Arith3Inst *this,ostream *o)

{
  ostream *in_RSI;
  ostream *in_RDI;
  Reg in_stack_0000001c;
  ostream *in_stack_00000020;
  
  display_op((OpCode)((ulong)in_RSI >> 0x20),in_RDI);
  display_cond((ConditionCode)((ulong)in_RSI >> 0x38),in_RDI);
  std::operator<<(in_RSI," ");
  display_reg_name(in_stack_00000020,in_stack_0000001c);
  std::operator<<(in_RSI,", ");
  display_reg_name(in_stack_00000020,in_stack_0000001c);
  std::operator<<(in_RSI,", ");
  prelude::operator<<(in_RSI,(Displayable *)in_RDI);
  return;
}

Assistant:

void Arith3Inst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, rd);
  o << ", ";
  display_reg_name(o, r1);
  o << ", " << r2;
}